

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_A_IceSetTics(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *thing;
  DObject *this;
  uint uVar1;
  int iVar2;
  FTerrainDef *pFVar3;
  bool bVar4;
  bool local_52;
  bool local_4f;
  int floor;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                  ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    thing = (AActor *)(param->field_0).field_1.a;
    local_4f = true;
    if (thing != (AActor *)0x0) {
      local_4f = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
    }
    if (local_4f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                    ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
        bVar4 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                      ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_52 = true;
      if (this != (DObject *)0x0) {
        local_52 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_52 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                      ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, param[2].field_0.field_1.atag != 8)) {
        bVar4 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                      ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    uVar1 = FRandom::operator()(&pr_icesettics);
    thing->tics = (uVar1 & 0x3f) + 0x46;
    iVar2 = P_GetThingFloorType(thing);
    pFVar3 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)iVar2);
    bVar4 = FName::operator==(&pFVar3->DamageMOD,NAME_Fire);
    if (bVar4) {
      thing->tics = thing->tics >> 2;
    }
    else {
      pFVar3 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)iVar2);
      bVar4 = FName::operator==(&pFVar3->DamageMOD,NAME_Ice);
      if (bVar4) {
        thing->tics = thing->tics << 1;
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xf6,"int AF_A_IceSetTics(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceSetTics)
{
	PARAM_ACTION_PROLOGUE;

	int floor;

	self->tics = 70+(pr_icesettics()&63);
	floor = P_GetThingFloorType (self);
	if (Terrains[floor].DamageMOD == NAME_Fire)
	{
		self->tics >>= 2;
	}
	else if (Terrains[floor].DamageMOD == NAME_Ice)
	{
		self->tics <<= 1;
	}
	return 0;
}